

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

LogicalType * __thiscall
duckdb_parquet::LogicalType::operator=(LogicalType *this,LogicalType *other53)

{
  TimeType *in_RSI;
  LogicalType *in_RDI;
  
  StringType::operator=(&in_RDI->STRING,(StringType *)&in_RSI->isAdjustedToUTC);
  MapType::operator=(&in_RDI->MAP,(MapType *)&in_RSI->unit);
  ListType::operator=(&in_RDI->LIST,(ListType *)&(in_RSI->unit).MILLIS);
  EnumType::operator=(&in_RDI->ENUM,(EnumType *)&(in_RSI->unit).MICROS);
  DecimalType::operator=(&in_RDI->DECIMAL,(DecimalType *)&(in_RSI->unit).NANOS);
  DateType::operator=(&in_RDI->DATE,(DateType *)(in_RSI + 1));
  TimeType::operator=(in_RSI,(TimeType *)in_RDI);
  TimestampType::operator=((TimestampType *)in_RSI,(TimestampType *)in_RDI);
  IntType::operator=(&in_RDI->INTEGER,(IntType *)&((TimestampType *)in_RSI)[3].isAdjustedToUTC);
  NullType::operator=(&in_RDI->UNKNOWN,(NullType *)&((TimestampType *)in_RSI)[3].unit.MILLIS);
  JsonType::operator=(&in_RDI->JSON,(JsonType *)&((TimestampType *)in_RSI)[3].unit.MICROS);
  BsonType::operator=(&in_RDI->BSON,(BsonType *)&((TimestampType *)in_RSI)[3].unit.NANOS);
  UUIDType::operator=(&in_RDI->UUID,(UUIDType *)&((TimestampType *)in_RSI)[3].unit.__isset);
  Float16Type::operator=(&in_RDI->FLOAT16,(Float16Type *)((TimestampType *)in_RSI + 4));
  in_RDI->__isset = *(_LogicalType__isset *)&((TimestampType *)in_RSI)[4].isAdjustedToUTC;
  return in_RDI;
}

Assistant:

LogicalType& LogicalType::operator=(const LogicalType& other53) noexcept {
  STRING = other53.STRING;
  MAP = other53.MAP;
  LIST = other53.LIST;
  ENUM = other53.ENUM;
  DECIMAL = other53.DECIMAL;
  DATE = other53.DATE;
  TIME = other53.TIME;
  TIMESTAMP = other53.TIMESTAMP;
  INTEGER = other53.INTEGER;
  UNKNOWN = other53.UNKNOWN;
  JSON = other53.JSON;
  BSON = other53.BSON;
  UUID = other53.UUID;
  FLOAT16 = other53.FLOAT16;
  __isset = other53.__isset;
  return *this;
}